

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O1

void __thiscall ExecutorX86::ExecutorX86(ExecutorX86 *this,Linker *linker)

{
  char *pcVar1;
  
  this->exLinker = linker;
  this->exTypes = &linker->exTypes;
  this->exFunctions = &linker->exFunctions;
  this->exRegVmCode = &linker->exRegVmCode;
  this->exRegVmConstants = &linker->exRegVmConstants;
  this->exRegVmRegKillInfo = &linker->exRegVmRegKillInfo;
  memset(&(this->vmState).ctx,0,0x8c);
  (this->vmState).tempStackArrayBase = (uint *)0x0;
  (this->vmState).tempStackArrayEnd = (uint *)0x0;
  (this->vmState).callInstructionPos = 0;
  memset(&(this->vmState).instAddress,0,0x9a);
  (this->expiredCodeBlocks).data = (ExpiredCodeBlock *)0x0;
  (this->expiredCodeBlocks).max = 0;
  (this->expiredCodeBlocks).count = 0;
  (this->instList).data = (x86Instruction *)0x0;
  (this->instList).max = 0;
  (this->instList).count = 0;
  (this->breakInstructions).data = (Breakpoint *)0x0;
  (this->breakInstructions).max = 0;
  (this->breakInstructions).count = 0;
  this->codeGenCtx = (CodeGenRegVmContext *)0x0;
  (this->codeJumpTargets).data = (uint *)0x0;
  (this->codeJumpTargets).max = 0;
  (this->codeJumpTargets).count = 0;
  (this->codeRegKillInfoOffsets).data = (uint *)0x0;
  (this->codeRegKillInfoOffsets).max = 0;
  (this->codeRegKillInfoOffsets).count = 0;
  (this->instAddress).data = (uchar **)0x0;
  (this->instAddress).max = 0;
  (this->instAddress).count = 0;
  (this->functionAddress).data = (uchar **)0x0;
  (this->functionAddress).max = 0;
  (this->functionAddress).count = 0;
  (this->expiredFunctionAddressLists).data = (ExpiredFunctionAddressList *)0x0;
  (this->expiredFunctionAddressLists).max = 0;
  (this->expiredFunctionAddressLists).count = 0;
  (this->globalCodeRanges).data = (uint *)0x0;
  (this->globalCodeRanges).max = 0;
  (this->globalCodeRanges).count = 0;
  (this->functionWin64UnwindTable).data = (_RUNTIME_FUNCTION *)0x0;
  (this->functionWin64UnwindTable).max = 0;
  (this->functionWin64UnwindTable).count = 0;
  pcVar1 = (char *)(*(code *)NULLC::alloc)(0x10000);
  this->execErrorBuffer = pcVar1;
  *pcVar1 = '\0';
  NULLC::fillMemory(this->execResult,0,0x200);
  this->codeRunning = false;
  this->minStackSize = 0x100000;
  this->lastFinalReturn = 0;
  this->callContinue = true;
  this->breakFunctionContext = (void *)0x0;
  this->breakFunction = (_func_uint_void_ptr_uint *)0x0;
  NULLC::fillMemory(this->codeLaunchHeader,0,0x1000);
  this->binCode = (uchar *)0x0;
  this->binCodeSize = 0;
  this->binCodeReserved = 0;
  this->codeLaunchHeaderLength = 0;
  this->codeLaunchUnwindOffset = 0;
  this->codeLaunchDataLength = 0;
  this->oldCodeLaunchHeaderProtect = 0;
  this->codeLaunchWin64UnwindTable = (RUNTIME_FUNCTION *)0x0;
  this->lastInstructionCount = 0;
  this->oldJumpTargetCount = 0;
  this->oldRegKillInfoCount = 0;
  this->oldFunctionSize = 0;
  this->oldCodeBodyProtect = 0;
  NULLC::currExecutor = this;
  return;
}

Assistant:

ExecutorX86::ExecutorX86(Linker *linker): exLinker(linker), exTypes(linker->exTypes), exFunctions(linker->exFunctions), exRegVmCode(linker->exRegVmCode), exRegVmConstants(linker->exRegVmConstants), exRegVmRegKillInfo(linker->exRegVmRegKillInfo)
{
	codeGenCtx = NULL;

	execErrorBuffer = (char*)NULLC::alloc(NULLC_ERROR_BUFFER_SIZE);
	*execErrorBuffer = 0;

	NULLC::fillMemory(execResult, 0, execResultSize);

	codeRunning = false;

	minStackSize = 1 * 1024 * 1024;

	lastFinalReturn = 0;

	callContinue = true;

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	dcCallVM = NULL;
#endif

	breakFunctionContext = NULL;
	breakFunction = NULL;

	NULLC::fillMemory(codeLaunchHeader, 0, codeLaunchHeaderSize);
	oldCodeLaunchHeaderProtect = 0;

	codeLaunchHeaderLength = 0;
	codeLaunchUnwindOffset = 0;
	codeLaunchDataLength = 0;
	codeLaunchWin64UnwindTable = NULL;

	binCode = NULL;
	binCodeSize = 0;
	binCodeReserved = 0;

	lastInstructionCount = 0;

	oldJumpTargetCount = 0;
	oldRegKillInfoCount = 0;
	oldFunctionSize = 0;
	oldCodeBodyProtect = 0;

	NULLC::currExecutor = this;
}